

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fadst8x8_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  undefined7 in_register_00000011;
  uint uVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  
  uVar14 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar13 = (long)(int)uVar14 * 0x100;
  iVar15 = 1 << (cos_bit - 1U & 0x1f);
  auVar21._4_4_ = iVar15;
  auVar21._0_4_ = iVar15;
  auVar21._8_4_ = iVar15;
  auVar21._12_4_ = iVar15;
  auVar21._16_4_ = iVar15;
  auVar21._20_4_ = iVar15;
  auVar21._24_4_ = iVar15;
  auVar21._28_4_ = iVar15;
  uVar16 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  iVar15 = (uVar16 & 0xffff) + uVar16 * 0x10000;
  auVar24._4_4_ = iVar15;
  auVar24._0_4_ = iVar15;
  auVar24._8_4_ = iVar15;
  auVar24._12_4_ = iVar15;
  auVar24._16_4_ = iVar15;
  auVar24._20_4_ = iVar15;
  auVar24._24_4_ = iVar15;
  auVar24._28_4_ = iVar15;
  iVar15 = (uVar16 & 0xffff) + uVar16 * -0x10000;
  auVar25._4_4_ = iVar15;
  auVar25._0_4_ = iVar15;
  auVar25._8_4_ = iVar15;
  auVar25._12_4_ = iVar15;
  auVar25._16_4_ = iVar15;
  auVar25._20_4_ = iVar15;
  auVar25._24_4_ = iVar15;
  auVar25._28_4_ = iVar15;
  uVar16 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  uVar17 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  uVar18 = uVar17 << 0x10 | uVar16 & 0xffff;
  auVar22._4_4_ = uVar18;
  auVar22._0_4_ = uVar18;
  auVar22._8_4_ = uVar18;
  auVar22._12_4_ = uVar18;
  auVar22._16_4_ = uVar18;
  auVar22._20_4_ = uVar18;
  auVar22._24_4_ = uVar18;
  auVar22._28_4_ = uVar18;
  iVar15 = (uVar17 & 0xffff) + uVar16 * -0x10000;
  auVar27._4_4_ = iVar15;
  auVar27._0_4_ = iVar15;
  auVar27._8_4_ = iVar15;
  auVar27._12_4_ = iVar15;
  auVar27._16_4_ = iVar15;
  auVar27._20_4_ = iVar15;
  auVar27._24_4_ = iVar15;
  auVar27._28_4_ = iVar15;
  auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  auVar29 = vpsubsw_avx2(auVar26,(undefined1  [32])input[7]);
  auVar10 = vpsubsw_avx2(auVar26,(undefined1  [32])input[3]);
  auVar33 = vpsubsw_avx2(auVar26,(undefined1  [32])input[1]);
  uVar16 = -uVar17 & 0xffff | uVar16 * 0x10000;
  auVar30 = vpunpcklwd_avx2(auVar10,(undefined1  [32])input[4]);
  auVar12 = vpunpckhwd_avx2(auVar10,(undefined1  [32])input[4]);
  auVar10 = vpmaddwd_avx2(auVar30,auVar24);
  auVar9 = vpmaddwd_avx2(auVar12,auVar24);
  auVar10 = vpaddd_avx2(auVar10,auVar21);
  auVar9 = vpaddd_avx2(auVar9,auVar21);
  auVar10 = vpsrad_avx2(auVar10,ZEXT416(uVar14));
  auVar9 = vpsrad_avx2(auVar9,ZEXT416(uVar14));
  auVar10 = vpackssdw_avx2(auVar10,auVar9);
  auVar26 = vpsubsw_avx2(auVar26,(undefined1  [32])input[5]);
  auVar9 = vpmaddwd_avx2(auVar30,auVar25);
  auVar12 = vpmaddwd_avx2(auVar12,auVar25);
  auVar9 = vpaddd_avx2(auVar9,auVar21);
  auVar12 = vpaddd_avx2(auVar12,auVar21);
  auVar20 = ZEXT416(uVar14);
  auVar9 = vpsrad_avx2(auVar9,auVar20);
  auVar12 = vpsrad_avx2(auVar12,auVar20);
  auVar9 = vpackssdw_avx2(auVar9,auVar12);
  auVar30 = vpunpcklwd_avx2((undefined1  [32])input[2],auVar26);
  auVar31 = vpunpckhwd_avx2((undefined1  [32])input[2],auVar26);
  auVar12 = vpmaddwd_avx2(auVar30,auVar24);
  auVar26 = vpmaddwd_avx2(auVar31,auVar24);
  auVar30 = vpmaddwd_avx2(auVar30,auVar25);
  auVar31 = vpmaddwd_avx2(auVar31,auVar25);
  auVar12 = vpaddd_avx2(auVar12,auVar21);
  auVar26 = vpaddd_avx2(auVar26,auVar21);
  auVar12 = vpsrad_avx2(auVar12,auVar20);
  auVar26 = vpsrad_avx2(auVar26,auVar20);
  auVar12 = vpackssdw_avx2(auVar12,auVar26);
  auVar26 = vpaddd_avx2(auVar30,auVar21);
  auVar30 = vpaddd_avx2(auVar31,auVar21);
  auVar20 = ZEXT416(uVar14);
  auVar26 = vpsrad_avx2(auVar26,auVar20);
  auVar30 = vpsrad_avx2(auVar30,auVar20);
  auVar26 = vpackssdw_avx2(auVar26,auVar30);
  auVar30 = vpaddsw_avx2((undefined1  [32])*input,auVar10);
  auVar24 = vpsubsw_avx2((undefined1  [32])*input,auVar10);
  auVar31 = vpaddsw_avx2(auVar29,auVar9);
  auVar25 = vpsubsw_avx2(auVar29,auVar9);
  auVar10 = vpaddsw_avx2(auVar33,auVar12);
  auVar33 = vpsubsw_avx2(auVar33,auVar12);
  auVar9 = vpaddsw_avx2((undefined1  [32])input[6],auVar26);
  auVar11 = vpsubsw_avx2((undefined1  [32])input[6],auVar26);
  auVar12 = vpunpcklwd_avx2(auVar10,auVar9);
  auVar26 = vpunpckhwd_avx2(auVar10,auVar9);
  auVar10 = vpmaddwd_avx2(auVar12,auVar22);
  auVar9 = vpmaddwd_avx2(auVar12,auVar27);
  auVar12 = vpmaddwd_avx2(auVar26,auVar27);
  auVar26 = vpmaddwd_avx2(auVar26,auVar22);
  auVar10 = vpaddd_avx2(auVar10,auVar21);
  auVar29 = vpsrad_avx2(auVar10,auVar20);
  auVar10 = vpaddd_avx2(auVar26,auVar21);
  auVar10 = vpsrad_avx2(auVar10,auVar20);
  auVar10 = vpackssdw_avx2(auVar29,auVar10);
  auVar26._4_4_ = uVar16;
  auVar26._0_4_ = uVar16;
  auVar26._8_4_ = uVar16;
  auVar26._12_4_ = uVar16;
  auVar26._16_4_ = uVar16;
  auVar26._20_4_ = uVar16;
  auVar26._24_4_ = uVar16;
  auVar26._28_4_ = uVar16;
  uVar16 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x250);
  uVar17 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x170);
  uVar18 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 400);
  auVar9 = vpaddd_avx2(auVar9,auVar21);
  auVar12 = vpaddd_avx2(auVar12,auVar21);
  auVar9 = vpsrad_avx2(auVar9,auVar20);
  auVar12 = vpsrad_avx2(auVar12,auVar20);
  uVar19 = uVar16 << 0x10 | uVar17 & 0xffff;
  auVar9 = vpackssdw_avx2(auVar9,auVar12);
  auVar29 = vpunpcklwd_avx2(auVar33,auVar11);
  auVar33 = vpunpckhwd_avx2(auVar33,auVar11);
  auVar12 = vpmaddwd_avx2(auVar29,auVar26);
  auVar26 = vpmaddwd_avx2(auVar33,auVar26);
  auVar29 = vpmaddwd_avx2(auVar29,auVar22);
  auVar33 = vpmaddwd_avx2(auVar33,auVar22);
  auVar23._4_4_ = uVar19;
  auVar23._0_4_ = uVar19;
  auVar23._8_4_ = uVar19;
  auVar23._12_4_ = uVar19;
  auVar23._16_4_ = uVar19;
  auVar23._20_4_ = uVar19;
  auVar23._24_4_ = uVar19;
  auVar23._28_4_ = uVar19;
  iVar15 = (uVar16 & 0xffff) + uVar17 * -0x10000;
  auVar12 = vpaddd_avx2(auVar12,auVar21);
  auVar26 = vpaddd_avx2(auVar26,auVar21);
  auVar12 = vpsrad_avx2(auVar12,auVar20);
  auVar26 = vpsrad_avx2(auVar26,auVar20);
  auVar12 = vpackssdw_avx2(auVar12,auVar26);
  auVar28._4_4_ = iVar15;
  auVar28._0_4_ = iVar15;
  auVar28._8_4_ = iVar15;
  auVar28._12_4_ = iVar15;
  auVar28._16_4_ = iVar15;
  auVar28._20_4_ = iVar15;
  auVar28._24_4_ = iVar15;
  auVar28._28_4_ = iVar15;
  uVar16 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1b0);
  uVar17 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x210);
  uVar19 = uVar17 << 0x10 | uVar16 & 0xffff;
  auVar26 = vpaddd_avx2(auVar29,auVar21);
  auVar20 = ZEXT416(uVar14);
  auVar29 = vpsrad_avx2(auVar26,auVar20);
  auVar26 = vpaddd_avx2(auVar33,auVar21);
  auVar26 = vpsrad_avx2(auVar26,auVar20);
  auVar26 = vpackssdw_avx2(auVar29,auVar26);
  auVar29 = vpaddsw_avx2(auVar30,auVar10);
  auVar33 = vpsubsw_avx2(auVar30,auVar10);
  auVar10 = vpaddsw_avx2(auVar9,auVar31);
  auVar11 = vpsubsw_avx2(auVar31,auVar9);
  auVar30 = vpaddsw_avx2(auVar12,auVar24);
  auVar24 = vpsubsw_avx2(auVar24,auVar12);
  auVar12 = vpaddsw_avx2(auVar26,auVar25);
  auVar25 = vpsubsw_avx2(auVar25,auVar26);
  auVar26 = vpunpcklwd_avx2(auVar29,auVar10);
  auVar31 = vpunpckhwd_avx2(auVar29,auVar10);
  auVar10 = vpmaddwd_avx2(auVar26,auVar23);
  auVar9 = vpmaddwd_avx2(auVar31,auVar23);
  auVar26 = vpmaddwd_avx2(auVar26,auVar28);
  auVar31 = vpmaddwd_avx2(auVar28,auVar31);
  auVar29._4_4_ = uVar19;
  auVar29._0_4_ = uVar19;
  auVar29._8_4_ = uVar19;
  auVar29._12_4_ = uVar19;
  auVar29._16_4_ = uVar19;
  auVar29._20_4_ = uVar19;
  auVar29._24_4_ = uVar19;
  auVar29._28_4_ = uVar19;
  iVar15 = (uVar17 & 0xffff) + uVar16 * -0x10000;
  auVar10 = vpaddd_avx2(auVar10,auVar21);
  auVar9 = vpaddd_avx2(auVar9,auVar21);
  auVar10 = vpsrad_avx2(auVar10,auVar20);
  auVar9 = vpsrad_avx2(auVar9,auVar20);
  alVar1 = (__m256i)vpackssdw_avx2(auVar10,auVar9);
  auVar32._4_4_ = iVar15;
  auVar32._0_4_ = iVar15;
  auVar32._8_4_ = iVar15;
  auVar32._12_4_ = iVar15;
  auVar32._16_4_ = iVar15;
  auVar32._20_4_ = iVar15;
  auVar32._24_4_ = iVar15;
  auVar32._28_4_ = iVar15;
  uVar16 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1f0);
  uVar17 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x1d0);
  auVar10 = vpaddd_avx2(auVar26,auVar21);
  auVar9 = vpaddd_avx2(auVar31,auVar21);
  auVar10 = vpsrad_avx2(auVar10,auVar20);
  auVar9 = vpsrad_avx2(auVar9,auVar20);
  uVar19 = uVar17 << 0x10 | uVar16 & 0xffff;
  alVar2 = (__m256i)vpackssdw_avx2(auVar10,auVar9);
  auVar31 = vpunpcklwd_avx2(auVar30,auVar12);
  auVar26 = vpunpckhwd_avx2(auVar30,auVar12);
  auVar10 = vpmaddwd_avx2(auVar31,auVar29);
  auVar9 = vpmaddwd_avx2(auVar26,auVar29);
  auVar12 = vpmaddwd_avx2(auVar31,auVar32);
  auVar26 = vpmaddwd_avx2(auVar26,auVar32);
  auVar34._4_4_ = uVar19;
  auVar34._0_4_ = uVar19;
  auVar34._8_4_ = uVar19;
  auVar34._12_4_ = uVar19;
  auVar34._16_4_ = uVar19;
  auVar34._20_4_ = uVar19;
  auVar34._24_4_ = uVar19;
  auVar34._28_4_ = uVar19;
  iVar15 = (uVar17 & 0xffff) + uVar16 * -0x10000;
  auVar10 = vpaddd_avx2(auVar10,auVar21);
  auVar9 = vpaddd_avx2(auVar9,auVar21);
  auVar10 = vpsrad_avx2(auVar10,auVar20);
  auVar9 = vpsrad_avx2(auVar9,auVar20);
  alVar3 = (__m256i)vpackssdw_avx2(auVar10,auVar9);
  auVar30._4_4_ = iVar15;
  auVar30._0_4_ = iVar15;
  auVar30._8_4_ = iVar15;
  auVar30._12_4_ = iVar15;
  auVar30._16_4_ = iVar15;
  auVar30._20_4_ = iVar15;
  auVar30._24_4_ = iVar15;
  auVar30._28_4_ = iVar15;
  uVar16 = *(uint *)((long)vert_filter_length_chroma + lVar13 + 0x230);
  auVar10 = vpaddd_avx2(auVar12,auVar21);
  auVar9 = vpaddd_avx2(auVar26,auVar21);
  auVar10 = vpsrad_avx2(auVar10,auVar20);
  auVar9 = vpsrad_avx2(auVar9,auVar20);
  uVar17 = uVar18 << 0x10 | uVar16 & 0xffff;
  alVar4 = (__m256i)vpackssdw_avx2(auVar10,auVar9);
  auVar12 = vpunpcklwd_avx2(auVar33,auVar11);
  auVar26 = vpunpckhwd_avx2(auVar33,auVar11);
  auVar10 = vpmaddwd_avx2(auVar12,auVar34);
  auVar9 = vpmaddwd_avx2(auVar34,auVar26);
  auVar12 = vpmaddwd_avx2(auVar12,auVar30);
  auVar26 = vpmaddwd_avx2(auVar30,auVar26);
  auVar31._4_4_ = uVar17;
  auVar31._0_4_ = uVar17;
  auVar31._8_4_ = uVar17;
  auVar31._12_4_ = uVar17;
  auVar31._16_4_ = uVar17;
  auVar31._20_4_ = uVar17;
  auVar31._24_4_ = uVar17;
  auVar31._28_4_ = uVar17;
  iVar15 = (uVar18 & 0xffff) + uVar16 * -0x10000;
  auVar10 = vpaddd_avx2(auVar10,auVar21);
  auVar9 = vpaddd_avx2(auVar9,auVar21);
  auVar10 = vpsrad_avx2(auVar10,auVar20);
  auVar9 = vpsrad_avx2(auVar9,auVar20);
  alVar5 = (__m256i)vpackssdw_avx2(auVar10,auVar9);
  auVar33._4_4_ = iVar15;
  auVar33._0_4_ = iVar15;
  auVar33._8_4_ = iVar15;
  auVar33._12_4_ = iVar15;
  auVar33._16_4_ = iVar15;
  auVar33._20_4_ = iVar15;
  auVar33._24_4_ = iVar15;
  auVar33._28_4_ = iVar15;
  auVar10 = vpaddd_avx2(auVar12,auVar21);
  auVar9 = vpsrad_avx2(auVar10,auVar20);
  auVar10 = vpaddd_avx2(auVar26,auVar21);
  auVar10 = vpsrad_avx2(auVar10,auVar20);
  alVar6 = (__m256i)vpackssdw_avx2(auVar9,auVar10);
  auVar12 = vpunpcklwd_avx2(auVar24,auVar25);
  auVar26 = vpunpckhwd_avx2(auVar24,auVar25);
  auVar10 = vpmaddwd_avx2(auVar12,auVar31);
  auVar9 = vpmaddwd_avx2(auVar31,auVar26);
  auVar12 = vpmaddwd_avx2(auVar12,auVar33);
  auVar26 = vpmaddwd_avx2(auVar33,auVar26);
  auVar10 = vpaddd_avx2(auVar10,auVar21);
  auVar9 = vpaddd_avx2(auVar9,auVar21);
  auVar12 = vpaddd_avx2(auVar12,auVar21);
  auVar26 = vpaddd_avx2(auVar26,auVar21);
  auVar10 = vpsrad_avx2(auVar10,auVar20);
  auVar9 = vpsrad_avx2(auVar9,auVar20);
  auVar12 = vpsrad_avx2(auVar12,ZEXT416(uVar14));
  alVar7 = (__m256i)vpackssdw_avx2(auVar10,auVar9);
  auVar10 = vpsrad_avx2(auVar26,ZEXT416(uVar14));
  alVar8 = (__m256i)vpackssdw_avx2(auVar12,auVar10);
  *output = alVar2;
  output[1] = alVar7;
  output[2] = alVar4;
  output[3] = alVar5;
  output[4] = alVar6;
  output[5] = alVar3;
  output[6] = alVar8;
  output[7] = alVar1;
  return;
}

Assistant:

static inline void fadst8x8_new_avx2(const __m256i *input, __m256i *output,
                                     int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __zero = _mm256_setzero_si256();
  const __m256i __rounding = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p16_p48 = pair_set_w16_epi16(cospi[16], cospi[48]);
  __m256i cospi_p48_m16 = pair_set_w16_epi16(cospi[48], -cospi[16]);
  __m256i cospi_m48_p16 = pair_set_w16_epi16(-cospi[48], cospi[16]);
  __m256i cospi_p04_p60 = pair_set_w16_epi16(cospi[4], cospi[60]);
  __m256i cospi_p60_m04 = pair_set_w16_epi16(cospi[60], -cospi[4]);
  __m256i cospi_p20_p44 = pair_set_w16_epi16(cospi[20], cospi[44]);
  __m256i cospi_p44_m20 = pair_set_w16_epi16(cospi[44], -cospi[20]);
  __m256i cospi_p36_p28 = pair_set_w16_epi16(cospi[36], cospi[28]);
  __m256i cospi_p28_m36 = pair_set_w16_epi16(cospi[28], -cospi[36]);
  __m256i cospi_p52_p12 = pair_set_w16_epi16(cospi[52], cospi[12]);
  __m256i cospi_p12_m52 = pair_set_w16_epi16(cospi[12], -cospi[52]);

  // stage 1
  __m256i x1[8];
  x1[0] = input[0];
  x1[1] = _mm256_subs_epi16(__zero, input[7]);
  x1[2] = _mm256_subs_epi16(__zero, input[3]);
  x1[3] = input[4];
  x1[4] = _mm256_subs_epi16(__zero, input[1]);
  x1[5] = input[6];
  x1[6] = input[2];
  x1[7] = _mm256_subs_epi16(__zero, input[5]);

  // stage 2
  __m256i x2[8];
  x2[0] = x1[0];
  x2[1] = x1[1];
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[2], &x1[3], __rounding,
                  cos_bit);
  x2[2] = x1[2];
  x2[3] = x1[3];
  x2[4] = x1[4];
  x2[5] = x1[5];
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[6], &x1[7], __rounding,
                  cos_bit);
  x2[6] = x1[6];
  x2[7] = x1[7];

  // stage 3
  __m256i x3[8];
  x3[0] = _mm256_adds_epi16(x2[0], x2[2]);
  x3[2] = _mm256_subs_epi16(x2[0], x2[2]);
  x3[1] = _mm256_adds_epi16(x2[1], x2[3]);
  x3[3] = _mm256_subs_epi16(x2[1], x2[3]);
  x3[4] = _mm256_adds_epi16(x2[4], x2[6]);
  x3[6] = _mm256_subs_epi16(x2[4], x2[6]);
  x3[5] = _mm256_adds_epi16(x2[5], x2[7]);
  x3[7] = _mm256_subs_epi16(x2[5], x2[7]);

  // stage 4
  __m256i x4[8];
  x4[0] = x3[0];
  x4[1] = x3[1];
  x4[2] = x3[2];
  x4[3] = x3[3];
  btf_16_w16_avx2(cospi_p16_p48, cospi_p48_m16, &x3[4], &x3[5], __rounding,
                  cos_bit);
  x4[4] = x3[4];
  x4[5] = x3[5];
  btf_16_w16_avx2(cospi_m48_p16, cospi_p16_p48, &x3[6], &x3[7], __rounding,
                  cos_bit);
  x4[6] = x3[6];
  x4[7] = x3[7];

  // stage 5
  __m256i x5[8];
  x5[0] = _mm256_adds_epi16(x4[0], x4[4]);
  x5[4] = _mm256_subs_epi16(x4[0], x4[4]);
  x5[1] = _mm256_adds_epi16(x4[1], x4[5]);
  x5[5] = _mm256_subs_epi16(x4[1], x4[5]);
  x5[2] = _mm256_adds_epi16(x4[2], x4[6]);
  x5[6] = _mm256_subs_epi16(x4[2], x4[6]);
  x5[3] = _mm256_adds_epi16(x4[3], x4[7]);
  x5[7] = _mm256_subs_epi16(x4[3], x4[7]);

  // stage 6
  __m256i x6[8];
  btf_16_w16_avx2(cospi_p04_p60, cospi_p60_m04, &x5[0], &x5[1], __rounding,
                  cos_bit);
  x6[0] = x5[0];
  x6[1] = x5[1];
  btf_16_w16_avx2(cospi_p20_p44, cospi_p44_m20, &x5[2], &x5[3], __rounding,
                  cos_bit);
  x6[2] = x5[2];
  x6[3] = x5[3];
  btf_16_w16_avx2(cospi_p36_p28, cospi_p28_m36, &x5[4], &x5[5], __rounding,
                  cos_bit);
  x6[4] = x5[4];
  x6[5] = x5[5];
  btf_16_w16_avx2(cospi_p52_p12, cospi_p12_m52, &x5[6], &x5[7], __rounding,
                  cos_bit);
  x6[6] = x5[6];
  x6[7] = x5[7];

  // stage 7
  output[0] = x6[1];
  output[1] = x6[6];
  output[2] = x6[3];
  output[3] = x6[4];
  output[4] = x6[5];
  output[5] = x6[2];
  output[6] = x6[7];
  output[7] = x6[0];
}